

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O3

char * __thiscall
testing::internal::TypedTestCasePState::VerifyRegisteredTestNames
          (TypedTestCasePState *this,char *file,int line,char *registered_tests)

{
  byte *pbVar1;
  _Rb_tree_node_base *p_Var2;
  int iVar3;
  char *pcVar4;
  const_iterator cVar5;
  char *pcVar6;
  size_t sVar7;
  _Rb_tree_node_base *p_Var8;
  undefined8 extraout_RAX;
  int line_00;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar9;
  ostream *poVar10;
  char *pcVar11;
  string name;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tests;
  key_type local_b8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  uint local_8c;
  internal *local_88;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  string local_50;
  
  pcVar11 = registered_tests + -1;
  *this = (TypedTestCasePState)0x1;
  local_8c = line;
  local_88 = (internal *)file;
  do {
    pbVar1 = (byte *)(pcVar11 + 1);
    pcVar11 = pcVar11 + 1;
    iVar3 = isspace((uint)*pbVar1);
  } while (iVar3 != 0);
  Message::Message((Message *)&local_98);
  local_80._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_80._M_impl.super__Rb_tree_header._M_header;
  local_80._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_80._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_80._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = (_Rb_tree_node_base *)(this + 0x10);
  pcVar6 = pcVar11;
  local_80._M_impl.super__Rb_tree_header._M_header._M_right =
       local_80._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    pcVar4 = strchr(pcVar6,0x2c);
    if (pcVar4 == (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,pcVar6,(allocator<char> *)&local_50);
    }
    else {
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,pcVar6,pcVar4);
    }
    cVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&local_80,&local_b8);
    if ((_Rb_tree_header *)cVar5._M_node == &local_80._M_impl.super__Rb_tree_header) {
      for (p_Var8 = *(_Rb_tree_node_base **)(this + 0x20); p_Var8 != p_Var2;
          p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
        iVar3 = std::__cxx11::string::compare((char *)&local_b8);
        if (iVar3 == 0) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&local_80,&local_b8);
          goto LAB_002fd816;
        }
      }
      poVar10 = (ostream *)(local_98.ptr_ + 0x10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"No test named ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,local_b8._M_dataplus._M_p,local_b8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10," can be found in this test case.\n",0x21);
    }
    else {
      poVar10 = (ostream *)(local_98.ptr_ + 0x10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"Test ",5);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,local_b8._M_dataplus._M_p,local_b8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10," is listed more than once.\n",0x1b);
    }
LAB_002fd816:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    pcVar6 = strchr(pcVar6,0x2c);
    if (pcVar6 == (char *)0x0) {
      p_Var8 = *(_Rb_tree_node_base **)(this + 0x20);
      sVar9.ptr_ = local_98.ptr_;
      if (p_Var8 != p_Var2) {
        poVar10 = (ostream *)(local_98.ptr_ + 0x10);
        do {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b8,*(char **)(p_Var8 + 1),(allocator<char> *)&local_50);
          cVar5 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find(&local_80,&local_b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          if ((_Rb_tree_header *)cVar5._M_node == &local_80._M_impl.super__Rb_tree_header) {
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,"You forgot to list test ",0x18);
            pcVar6 = *(char **)(p_Var8 + 1);
            if (pcVar6 == (char *)0x0) {
              sVar7 = 6;
              pcVar6 = "(null)";
            }
            else {
              sVar7 = strlen(pcVar6);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar6,sVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,".\n",2);
          }
          p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
        } while (p_Var8 != p_Var2);
      }
      line_00 = (int)sVar9.ptr_;
      StringStreamToString(&local_b8,local_98.ptr_);
      iVar3 = std::__cxx11::string::compare((char *)&local_b8);
      if (iVar3 == 0) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree(&local_80);
        if (local_98.ptr_ != (stringstream *)0x0) {
          (**(code **)(*(long *)local_98.ptr_ + 8))(local_98.ptr_);
        }
        return pcVar11;
      }
      FormatFileLocation_abi_cxx11_(&local_50,local_88,(char *)(ulong)local_8c,line_00);
      VerifyRegisteredTestNames();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_80);
      if (local_98.ptr_ != (stringstream *)0x0) {
        (**(code **)(*(long *)local_98.ptr_ + 8))(local_98.ptr_);
      }
      _Unwind_Resume(extraout_RAX);
    }
    do {
      pbVar1 = (byte *)(pcVar6 + 1);
      pcVar6 = pcVar6 + 1;
      iVar3 = isspace((uint)*pbVar1);
    } while (iVar3 != 0);
  } while( true );
}

Assistant:

const char* TypedTestCasePState::VerifyRegisteredTestNames(
    const char* file, int line, const char* registered_tests) {
  typedef ::std::set<const char*>::const_iterator DefinedTestIter;
  registered_ = true;

  // Skip initial whitespace in registered_tests since some
  // preprocessors prefix stringizied literals with whitespace.
  registered_tests = SkipSpaces(registered_tests);

  Message errors;
  ::std::set<std::string> tests;
  for (const char* names = registered_tests; names != NULL;
       names = SkipComma(names)) {
    const std::string name = GetPrefixUntilComma(names);
    if (tests.count(name) != 0) {
      errors << "Test " << name << " is listed more than once.\n";
      continue;
    }

    bool found = false;
    for (DefinedTestIter it = defined_test_names_.begin();
         it != defined_test_names_.end();
         ++it) {
      if (name == *it) {
        found = true;
        break;
      }
    }

    if (found) {
      tests.insert(name);
    } else {
      errors << "No test named " << name
             << " can be found in this test case.\n";
    }
  }

  for (DefinedTestIter it = defined_test_names_.begin();
       it != defined_test_names_.end();
       ++it) {
    if (tests.count(*it) == 0) {
      errors << "You forgot to list test " << *it << ".\n";
    }
  }

  const std::string& errors_str = errors.GetString();
  if (errors_str != "") {
    fprintf(stderr, "%s %s", FormatFileLocation(file, line).c_str(),
            errors_str.c_str());
    fflush(stderr);
    posix::Abort();
  }

  return registered_tests;
}